

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O0

void deqp::gles2::Functional::anon_unknown_0::checkPointerEquals
               (TestContext *testCtx,void *got,void *expected)

{
  qpTestResult qVar1;
  TestLog *this;
  MessageBuilder *pMVar2;
  MessageBuilder local_1a0;
  void *local_20;
  void *expected_local;
  void *got_local;
  TestContext *testCtx_local;
  
  if (got != expected) {
    local_20 = expected;
    expected_local = got;
    got_local = testCtx;
    this = tcu::TestContext::getLog(testCtx);
    tcu::TestLog::operator<<(&local_1a0,this,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_1a0,(char (*) [20])"// ERROR: Expected ");
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_20);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [7])0x2b8b5f6);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&expected_local);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a0);
    qVar1 = tcu::TestContext::getTestResult((TestContext *)got_local);
    if (qVar1 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                ((TestContext *)got_local,QP_TEST_RESULT_FAIL,"got invalid value");
    }
  }
  return;
}

Assistant:

void checkPointerEquals (tcu::TestContext& testCtx, const void* got, const void* expected)
{
	using tcu::TestLog;

	if (got != expected)
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: Expected " << expected << "; got " << got << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid value");
	}
}